

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O0

int i2d_PKCS12_fp(FILE *fp,PKCS12 *p12)

{
  BIO *bp;
  int ret;
  BIO *bio;
  PKCS12 *p12_local;
  FILE *fp_local;
  
  bp = BIO_new_fp(fp,0);
  if (bp == (BIO *)0x0) {
    fp_local._4_4_ = 0;
  }
  else {
    fp_local._4_4_ = i2d_PKCS12_bio(bp,p12);
    BIO_free(bp);
  }
  return fp_local._4_4_;
}

Assistant:

int i2d_PKCS12_fp(FILE *fp, const PKCS12 *p12) {
  BIO *bio = BIO_new_fp(fp, 0 /* don't take ownership */);
  if (bio == NULL) {
    return 0;
  }

  int ret = i2d_PKCS12_bio(bio, p12);
  BIO_free(bio);
  return ret;
}